

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O2

void __thiscall
trun::TestResponseProxy::Fatal(TestResponseProxy *this,int line,char *file,string *message)

{
  TestResponseProxy *this_00;
  allocator<char> local_61;
  string local_60;
  
  gnilk::Log::Debug<char_const*,char_const*,int,char_const*>
            (this->pLogger,"%s:%d:\t\'%s\'",file,line,(message->_M_dataplus)._M_p);
  printf("*** FATAL ERROR: %s:%d\t\'%s\'\n",file,line,(message->_M_dataplus)._M_p);
  this->errorCount = this->errorCount + 1;
  if (this->testResult < kTestResult_ModuleFail) {
    this->testResult = kTestResult_ModuleFail;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffc0,file,&local_61);
  std::__cxx11::string::string((string *)&local_60,message);
  trun::AssertError::Add
            (&this->assertError,kAssert_Fatal,line,(string *)&stack0xffffffffffffffc0,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  this_00 = (TestResponseProxy *)&stack0xffffffffffffffc0;
  std::__cxx11::string::~string((string *)this_00);
  TerminateThreadIfNeeded(this_00);
  return;
}

Assistant:

void TestResponseProxy::Fatal(int line, const char *file, std::string message) {
    pLogger->Debug("%s:%d:\t'%s'", file, line, message.c_str());

    printf("*** FATAL ERROR: %s:%d\t'%s'\n", file, line, message.c_str());
    this->errorCount++;
    if (testResult < kTestResult_ModuleFail) {
        testResult = kTestResult_ModuleFail;
    }
    assertError.Add(AssertError::kAssert_Fatal, line, file, message);
    TerminateThreadIfNeeded();
}